

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::getGrad
          (FluctuatingChargeObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *grad)

{
  Molecule *i_00;
  Atom *pAVar1;
  value_type i_01;
  reference pvVar2;
  StuntDouble *in_RDI;
  RealType RVar3;
  int index;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  MoleculeIterator *in_stack_ffffffffffffffd8;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffe0;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18 [3];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                       *)&stack0xffffffffffffffe0);
  DynamicVector<double,_std::allocator<double>_>::setZero(in_stack_ffffffffffffffd0);
  for (i_00 = SimInfo::beginMolecule
                        ((SimInfo *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8);
      i_00 != (Molecule *)0x0;
      i_00 = SimInfo::nextMolecule
                       ((SimInfo *)in_stack_ffffffffffffffe0._M_current,(MoleculeIterator *)i_00)) {
    pAVar1 = Molecule::beginFluctuatingCharge
                       ((Molecule *)in_stack_ffffffffffffffe0._M_current,(iterator *)i_00);
    while (pAVar1 != (Atom *)0x0) {
      RVar3 = StuntDouble::getFlucQFrc(in_RDI);
      i_01 = -RVar3;
      pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                         ((DynamicVector<double,_std::allocator<double>_> *)in_RDI,(size_type)i_01);
      *pvVar2 = i_01;
      pAVar1 = Molecule::nextFluctuatingCharge
                         ((Molecule *)in_stack_ffffffffffffffe0._M_current,(iterator *)i_00);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeObjectiveFunction::getGrad(
      DynamicVector<RealType>& grad) {
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    grad.setZero();

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        grad[index++] = -atom->getFlucQFrc();
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &grad[0], nFlucQ_, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif
  }